

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::extract_features(search *sch,uint32_t idx,multi_ex *ec)

{
  v_array<unsigned_int> *this;
  long *plVar1;
  int *piVar2;
  int *piVar3;
  example *peVar4;
  uint uVar5;
  vw *pvVar6;
  uint64_t mask;
  long lVar7;
  example *peVar8;
  uint uVar9;
  byte *pbVar10;
  int iVar11;
  undefined4 uVar12;
  uint32_t *puVar13;
  int *piVar14;
  uint64_t idx_00;
  uint64_t multiplier;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t j;
  ulong uVar19;
  long lVar20;
  uint local_74;
  float new_weight;
  vw *local_40;
  size_t new_count;
  
  pvVar6 = Search::search::get_vw_pointer_unsafe(sch);
  plVar1 = (long *)sch->task_data;
  reset_ex((example *)*plVar1);
  mask = Search::search::get_mask(sch);
  puVar13 = &(pvVar6->weights).dense_weights._stride_shift;
  if ((pvVar6->weights).sparse != false) {
    puVar13 = &(pvVar6->weights).sparse_weights._stride_shift;
  }
  multiplier = (ulong)pvVar6->wpp << ((byte)*puVar13 & 0x3f);
  piVar2 = (int *)plVar1[0x13];
  piVar3 = (int *)plVar1[0x14];
  if (piVar2 == piVar3) {
    local_74 = 0;
  }
  else {
    local_74 = piVar3[-1];
  }
  this = (v_array<unsigned_int> *)(plVar1 + 0x1f);
  peVar4 = (example *)*plVar1;
  uVar19 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  for (lVar7 = 0x4b; lVar7 != 0x58; lVar7 = lVar7 + 1) {
    plVar1[lVar7] = 0;
  }
  piVar14 = piVar3;
  for (uVar15 = 0; piVar14 = piVar14 + -1, uVar15 != 3; uVar15 = uVar15 + 1) {
    if ((uVar15 < (ulong)((long)piVar3 - (long)piVar2 >> 2)) && (*piVar14 != 0)) {
      peVar8 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[*piVar14 - 1];
    }
    else {
      peVar8 = (example *)0x0;
    }
    plVar1[uVar15 + 0x4b] = (long)peVar8;
  }
  uVar15 = (ulong)idx;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    if ((uVar15 - 1) + lVar7 < uVar19) {
      peVar8 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar15 + lVar7 + -1];
    }
    else {
      peVar8 = (example *)0x0;
    }
    plVar1[lVar7 + 0x4e] = (long)peVar8;
  }
  uVar16 = (ulong)local_74;
  for (lVar7 = -0x20; lVar7 != 0; lVar7 = lVar7 + 8) {
    if ((local_74 != 0 && piVar2 != piVar3) &&
       (iVar11 = *(int *)(*(long *)((long)plVar1 + lVar7 * 4 + 600) + uVar16 * 4), iVar11 != 0)) {
      *(example **)((long)plVar1 + lVar7 + 0x2a8) =
           (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[iVar11 - 1];
    }
  }
  for (lVar7 = -0x10; lVar7 != 0; lVar7 = lVar7 + 8) {
    if ((uVar19 < uVar15) ||
       (iVar11 = *(int *)(*(long *)((long)plVar1 + lVar7 * 4 + 0x218) + uVar15 * 4), iVar11 == 0)) {
      peVar8 = (example *)0x0;
    }
    else {
      peVar8 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar11 - 1];
    }
    *(example **)((long)plVar1 + lVar7 + 0x2b8) = peVar8;
  }
  if ((((ulong)((long)piVar3 - (long)piVar2) < 5) || ((ulong)(uint)piVar3[-2] == 0)) ||
     (iVar11 = *(int *)(plVar1[0x3b] + (ulong)(uint)piVar3[-2] * 4), iVar11 == 0)) {
    peVar8 = (example *)0x0;
  }
  else {
    peVar8 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[iVar11 - 1];
  }
  plVar1[0x57] = (long)peVar8;
  idx_00 = 0x1a1d5191;
  local_40 = pvVar6;
  for (lVar7 = 0x4b; lVar7 != 0x58; lVar7 = lVar7 + 1) {
    if ((example *)plVar1[lVar7] == (example *)0x0) {
      add_feature(peVar4,idx_00,(char)lVar7 + 0xf7,mask,multiplier,false);
    }
    else {
      add_all_features(peVar4,(example *)plVar1[lVar7],(char)lVar7 + 0xf7,mask,multiplier,
                       idx_00 - 0x1a1d5191,false);
    }
    idx_00 = idx_00 + 0x5416d;
  }
  v_array<unsigned_int>::resize(this,10);
  if (piVar2 == piVar3) {
    *this->_begin = 0;
    this->_begin[1] = 1;
    uVar9 = 1;
  }
  else {
    if (uVar19 < uVar15) {
      iVar11 = 1;
    }
    else {
      uVar9 = idx - local_74;
      if (4 < idx - local_74) {
        uVar9 = 5;
      }
      iVar11 = uVar9 + 2;
    }
    *(int *)plVar1[0x1f] = iVar11;
    uVar9 = *(uint *)(plVar1[0x33] + uVar16 * 4);
    if (4 < uVar9) {
      uVar9 = 5;
    }
    *(uint *)(plVar1[0x1f] + 4) = uVar9 + 1;
    uVar9 = *(uint *)(plVar1[0x37] + uVar16 * 4);
    if (4 < uVar9) {
      uVar9 = 5;
    }
    uVar9 = uVar9 + 1;
  }
  this->_begin[2] = uVar9;
  if (uVar19 < uVar15) {
    uVar5 = 1;
  }
  else {
    uVar9 = *(uint *)(plVar1[0x33] + uVar15 * 4);
    uVar5 = 5;
    if (uVar9 < 5) {
      uVar5 = uVar9;
    }
    uVar5 = uVar5 + 1;
  }
  this->_begin[3] = uVar5;
  for (lVar7 = 0x3b; lVar7 != 0x4b; lVar7 = lVar7 + 4) {
    uVar12 = 0xf;
    if ((piVar2 != piVar3) && (uVar17 = (ulong)*(uint *)(plVar1[lVar7] + uVar16 * 4), uVar17 != 0))
    {
      uVar12 = *(undefined4 *)(plVar1[0x1b] + uVar17 * 4);
    }
    *(undefined4 *)((long)this->_begin + lVar7 + -0x2b) = uVar12;
  }
  for (lVar7 = 0x3b; lVar7 != 0x43; lVar7 = lVar7 + 4) {
    uVar12 = 0xf;
    if ((uVar15 <= uVar19) && (uVar16 = (ulong)*(uint *)(plVar1[lVar7] + uVar15 * 4), uVar16 != 0))
    {
      uVar12 = *(undefined4 *)(plVar1[0x1b] + uVar16 * 4);
    }
    *(undefined4 *)((long)this->_begin + lVar7 + -0x1b) = uVar12;
  }
  lVar7 = 0x20d8e94;
  lVar18 = 0;
  for (lVar20 = 0; lVar20 != 10; lVar20 = lVar20 + 1) {
    lVar7 = lVar7 + lVar18;
    features::push_back((peVar4->super_example_predict).feature_space + 100,1.0,
                        ((ulong)this->_begin[lVar20] + lVar7) * multiplier & mask);
    lVar18 = lVar18 + 0x3ff;
  }
  peVar4 = (example *)*plVar1;
  uVar19 = 0;
  for (pbVar10 = (peVar4->super_example_predict).indices._begin;
      pbVar10 != (peVar4->super_example_predict).indices._end; pbVar10 = pbVar10 + 1) {
    uVar19 = uVar19 + ((long)(peVar4->super_example_predict).feature_space[*pbVar10].values._end -
                       (long)(peVar4->super_example_predict).feature_space[*pbVar10].values._begin
                      >> 2);
  }
  INTERACTIONS::eval_count_of_generated_ft(local_40,peVar4,&new_count,&new_weight);
  *(size_t *)(*plVar1 + 0x68a0) = new_count + uVar19;
  *(float *)(*plVar1 + 0x68b4) = (float)uVar19 + new_weight;
  return;
}

Assistant:

void extract_features(Search::search &sch, uint32_t idx, multi_ex &ec)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = sch.get_task_data<task_data>();
  reset_ex(data->ex);
  uint64_t mask = sch.get_mask();
  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  v_array<uint32_t> &stack = data->stack, &tags = data->tags, *children = data->children, &temp = data->temp;
  example **ec_buf = data->ec_buf;
  example &ex = *(data->ex);

  size_t n = ec.size();
  bool empty = stack.empty();
  size_t last = empty ? 0 : stack.last();

  for (size_t i = 0; i < 13; i++) ec_buf[i] = nullptr;

  // feature based on the top three examples in stack ec_buf[0]: s1, ec_buf[1]: s2, ec_buf[2]: s3
  for (size_t i = 0; i < 3; i++)
    ec_buf[i] = (stack.size() > i && *(stack.end() - (i + 1)) != 0) ? ec[*(stack.end() - (i + 1)) - 1] : 0;

  // features based on examples in string buffer ec_buf[3]: b1, ec_buf[4]: b2, ec_buf[5]: b3
  for (size_t i = 3; i < 6; i++) ec_buf[i] = (idx + (i - 3) - 1 < n) ? ec[idx + i - 3 - 1] : 0;

  // features based on the leftmost and the rightmost children of the top element stack ec_buf[6]: sl1, ec_buf[7]: sl2,
  // ec_buf[8]: sr1, ec_buf[9]: sr2;
  for (size_t i = 6; i < 10; i++)
    if (!empty && last != 0 && children[i - 4][last] != 0)
      ec_buf[i] = ec[children[i - 4][last] - 1];

  // features based on leftmost children of the top element in bufer ec_buf[10]: bl1, ec_buf[11]: bl2
  for (size_t i = 10; i < 12; i++)
    ec_buf[i] = (idx <= n && children[i - 8][idx] != 0) ? ec[children[i - 8][idx] - 1] : 0;
  ec_buf[12] = (stack.size() > 1 && *(stack.end() - 2) != 0 && children[2][*(stack.end() - 2)] != 0)
      ? ec[children[2][*(stack.end() - 2)] - 1]
      : 0;

  // unigram features
  for (size_t i = 0; i < 13; i++)
  {
    uint64_t additional_offset = (uint64_t)(i * offset_const);
    if (!ec_buf[i])
      add_feature(ex, (uint64_t)438129041 + additional_offset, (unsigned char)((i + 1) + 'A'), mask, multiplier);
    else
      add_all_features(ex, *ec_buf[i], 'A' + (unsigned char)(i + 1), mask, multiplier, additional_offset, false);
  }

  // Other features
  temp.resize(10);
  temp[0] = empty ? 0 : (idx > n ? 1 : 2 + min(5, idx - (uint32_t)last));
  temp[1] = empty ? 1 : 1 + min(5, children[0][last]);
  temp[2] = empty ? 1 : 1 + min(5, children[1][last]);
  temp[3] = idx > n ? 1 : 1 + min(5, children[0][idx]);
  for (size_t i = 4; i < 8; i++) temp[i] = (!empty && children[i - 2][last] != 0) ? tags[children[i - 2][last]] : 15;
  for (size_t i = 8; i < 10; i++) temp[i] = (idx <= n && children[i - 6][idx] != 0) ? tags[children[i - 6][idx]] : 15;

  uint64_t additional_offset = val_namespace * offset_const;
  for (size_t j = 0; j < 10; j++)
  {
    additional_offset += j * 1023;
    add_feature(ex, temp[j] + additional_offset, val_namespace, mask, multiplier);
  }
  size_t count = 0;
  for (features fs : *data->ex)
  {
    fs.sum_feat_sq = (float)fs.size();
    count += fs.size();
  }

  size_t new_count;
  float new_weight;
  INTERACTIONS::eval_count_of_generated_ft(all, *data->ex, new_count, new_weight);

  data->ex->num_features = count + new_count;
  data->ex->total_sum_feat_sq = (float)count + new_weight;
}